

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_viewConversion.h
# Opt level: O1

int __thiscall
gmlc::utilities::strViewToInteger<int>(utilities *this,string_view input,size_t *charactersUsed)

{
  out_of_range *this_00;
  long *plVar1;
  code *pcVar2;
  undefined *puVar3;
  char *__first;
  utilities *puVar4;
  __integer_from_chars_result_type<int> _Var5;
  int val;
  int local_1c;
  
  plVar1 = (long *)input._M_str;
  __first = (char *)input._M_len;
  local_1c = 0;
  if (plVar1 != (long *)0x0) {
    *plVar1 = 0;
  }
  puVar4 = (utilities *)0x0;
  if (this < (utilities *)0x2) goto LAB_0022a6e2;
  do {
    if (__first[(long)puVar4] != ' ') {
      if ((__first[(long)puVar4] != '0') || ((byte)((__first + 1)[(long)puVar4] | 0x20U) == 0x78))
      goto LAB_0022a6dc;
      goto LAB_0022a6d5;
    }
    puVar4 = puVar4 + 1;
  } while (this != puVar4);
  goto LAB_0022a6b1;
LAB_0022a6dc:
  __first = __first + (long)puVar4;
  this = this + -(long)puVar4;
LAB_0022a6e2:
  _Var5 = std::from_chars<int>(__first,(char *)(this + (long)__first),&local_1c,10);
  if (_Var5.ec != 0) {
    if (_Var5.ec == result_out_of_range) {
      if (plVar1 != (long *)0x0) {
        *plVar1 = (long)_Var5.ptr - (long)__first;
      }
      this_00 = (out_of_range *)__cxa_allocate_exception(0x10);
      std::out_of_range::out_of_range
                (this_00,"conversion type does not support the string conversion");
      puVar3 = &std::out_of_range::typeinfo;
      pcVar2 = std::out_of_range::~out_of_range;
    }
    else {
      this_00 = (out_of_range *)__cxa_allocate_exception(0x10);
      std::invalid_argument::invalid_argument
                ((invalid_argument *)this_00,"unable to convert string");
      puVar3 = &std::invalid_argument::typeinfo;
      pcVar2 = std::invalid_argument::~invalid_argument;
    }
    __cxa_throw(this_00,puVar3,pcVar2);
  }
  if (plVar1 == (long *)0x0) {
    return local_1c;
  }
  this = (utilities *)(_Var5.ptr + ((long)puVar4 - (long)__first));
  goto LAB_0022a709;
  while (puVar4 = puVar4 + 1, this != puVar4) {
LAB_0022a6d5:
    if (__first[(long)puVar4] != '0') goto LAB_0022a6dc;
  }
LAB_0022a6b1:
  if (plVar1 != (long *)0x0) {
LAB_0022a709:
    *plVar1 = (long)this;
  }
  return local_1c;
}

Assistant:

X strViewToInteger(std::string_view input, size_t* charactersUsed = nullptr)
{
    static_assert(std::is_integral_v<X>, "requested type is not integral");
    X val{0};
    if (charactersUsed != nullptr) {
        *charactersUsed = 0;
    }
    std::size_t additionalChars{0};
    if (input.size() > 1) {
        while (input[0] == ' ') {
            input.remove_prefix(1);
            ++additionalChars;
            if (input.empty()) {
                if (charactersUsed != nullptr) {
                    *charactersUsed = additionalChars;
                }
                return val;
            }
        }
        if (input.front() == '0') {
            if (input[1] != 'X' && input[1] != 'x') {
                while (input[0] == '0') {
                    input.remove_prefix(1);
                    ++additionalChars;
                    if (input.empty()) {
                        if (charactersUsed != nullptr) {
                            *charactersUsed = additionalChars;
                        }
                        return val;
                    }
                }
            }
        }
    }
    auto conversionResult =
        std::from_chars(input.data(), input.data() + input.size(), val);
    if (conversionResult.ec == std::errc()) {
        if (charactersUsed != nullptr) {
            *charactersUsed =
                (conversionResult.ptr - input.data()) + additionalChars;
        }
        return val;
    }
    if (conversionResult.ec == std::errc::result_out_of_range) {
        if (charactersUsed != nullptr) {
            *charactersUsed = (conversionResult.ptr - input.data());
        }
        throw(std::out_of_range(
            "conversion type does not support the string conversion"));
    }
    if constexpr (std::is_unsigned_v<X>) {
        if (input.size() > 1 && input.front() == '-') {
            auto signedVal =
                strViewToInteger<std::make_signed_t<X>>(input, charactersUsed);
            // additional chars must be 0 in this case otherwise it should have
            // been an error
            return static_cast<X>(signedVal);
        }
    }
    throw(std::invalid_argument("unable to convert string"));
}